

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O3

float GraphTask::macro_f(task_data *D)

{
  uint uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  uint32_t *puVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  sVar2 = D->K;
  if (sVar2 != 0) {
    uVar4 = 2;
    if (2 < sVar2 + 1) {
      uVar4 = sVar2 + 1;
    }
    puVar6 = D->confusion_matrix + sVar2 + 2;
    uVar7 = 1;
    fVar10 = 0.0;
    fVar11 = 0.0;
    puVar8 = puVar6;
    do {
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
      lVar5 = 0;
      puVar9 = puVar8;
      do {
        auVar17._4_4_ = 0;
        auVar17._0_4_ = puVar6[lVar5];
        auVar17._8_4_ = *puVar9;
        auVar17._12_4_ = 0;
        fVar12 = fVar12 + (float)(SUB168(auVar17 | _DAT_0027dcf0,0) - (double)DAT_0027dcf0);
        fVar13 = fVar13 + (float)(SUB168(auVar17 | _DAT_0027dcf0,8) - DAT_0027dcf0._8_8_);
        fVar14 = fVar14 + 0.0;
        fVar15 = fVar15 + 0.0;
        lVar5 = lVar5 + 1;
        puVar9 = puVar9 + sVar2 + 1;
      } while (uVar4 - 1 != lVar5);
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        uVar1 = D->confusion_matrix[(sVar2 + 2) * uVar7];
        fVar11 = fVar11 + 1.0;
        if (uVar1 != 0) {
          auVar16._0_4_ = (float)uVar1;
          auVar16._4_4_ = auVar16._0_4_;
          auVar16._8_4_ = auVar16._0_4_;
          auVar16._12_4_ = auVar16._0_4_;
          auVar3._4_4_ = fVar13;
          auVar3._0_4_ = fVar12;
          auVar3._8_4_ = fVar14;
          auVar3._12_4_ = fVar15;
          auVar17 = divps(auVar16,auVar3);
          fVar12 = auVar17._4_4_;
          fVar10 = fVar10 + ((fVar12 + fVar12) * auVar17._0_4_) / (fVar12 + auVar17._0_4_);
        }
      }
      uVar7 = uVar7 + 1;
      puVar8 = puVar8 + 1;
      puVar6 = puVar6 + sVar2 + 1;
    } while (uVar7 != uVar4);
    return fVar10 / fVar11;
  }
  return NAN;
}

Assistant:

float macro_f(task_data& D)
{
  float total_f1 = 0.;
  float count_f1 = 0.;
  for (size_t k = 1; k <= D.K; k++)
  {
    float trueC = 0.;
    float predC = 0.;
    for (size_t j = 1; j <= D.K; j++)
    {
      trueC += (float)D.confusion_matrix[IDX(k, j)];
      predC += (float)D.confusion_matrix[IDX(j, k)];
    }
    if (trueC == 0)
      continue;
    float correctC = (float)D.confusion_matrix[IDX(k, k)];
    count_f1++;
    if (correctC > 0)
    {
      float pre = correctC / predC;
      float rec = correctC / trueC;
      total_f1 += 2 * pre * rec / (pre + rec);
    }
  }
  return total_f1 / count_f1;
}